

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.h
# Opt level: O2

RWNode * __thiscall dg::dda::ReadWriteGraph::create(ReadWriteGraph *this,RWNodeType t)

{
  RWNodeCall *pRVar1;
  size_t sVar2;
  RWNodeCall *local_28;
  
  if (t == CALL) {
    pRVar1 = (RWNodeCall *)operator_new(0x1a8);
    sVar2 = this->lastNodeID + 1;
    this->lastNodeID = sVar2;
    RWNodeCall::RWNodeCall(pRVar1,(uint)sVar2);
    local_28 = pRVar1;
    std::
    vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
    ::emplace_back<dg::dda::RWNodeCall*>
              ((vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
                *)&this->_nodes,&local_28);
  }
  else {
    pRVar1 = (RWNodeCall *)operator_new(0x150);
    sVar2 = this->lastNodeID + 1;
    this->lastNodeID = sVar2;
    RWNode::RWNode((RWNode *)pRVar1,(uint)sVar2,t);
    local_28 = pRVar1;
    std::
    vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
    ::emplace_back<dg::dda::RWNode*>
              ((vector<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>,std::allocator<std::unique_ptr<dg::dda::RWNode,std::default_delete<dg::dda::RWNode>>>>
                *)&this->_nodes,(RWNode **)&local_28);
  }
  return (this->_nodes).
         super__Vector_base<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>,_std::allocator<std::unique_ptr<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<dg::dda::RWNode,_std::default_delete<dg::dda::RWNode>_>._M_t.
         super__Tuple_impl<0UL,_dg::dda::RWNode_*,_std::default_delete<dg::dda::RWNode>_>.
         super__Head_base<0UL,_dg::dda::RWNode_*,_false>._M_head_impl;
}

Assistant:

RWNode &create(RWNodeType t) {
        if (t == RWNodeType::CALL) {
            _nodes.emplace_back(new RWNodeCall(++lastNodeID));
        } else {
            _nodes.emplace_back(new RWNode(++lastNodeID, t));
        }
        return *_nodes.back().get();
    }